

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

BOOL __thiscall
Js::RecyclableMethodsGroupWalker::GetGroupObject
          (RecyclableMethodsGroupWalker *this,ResolvedObject *pResolvedObject)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  ArenaAllocator *alloc;
  RecyclableMethodsGroupDisplay *this_00;
  Type TVar6;
  
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xf4d,"(pResolvedObject)","pResolvedObject");
    if (!bVar2) goto LAB_008c96a6;
    *puVar4 = 0;
  }
  pResolvedObject->name = L"[Methods]";
  pRVar5 = VarTo<Js::RecyclableObject>((this->super_RecyclableObjectWalker).instance);
  pResolvedObject->obj = pRVar5;
  pResolvedObject->scriptContext = (this->super_RecyclableObjectWalker).scriptContext;
  if (pRVar5 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_008c96a6;
    *puVar4 = 0;
  }
  if (((ulong)pRVar5 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pRVar5 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_008c96a6;
    *puVar4 = 0;
  }
  TVar6 = TypeIds_FirstNumberType;
  if ((((ulong)pRVar5 & 0xffff000000000000) != 0x1000000000000) &&
     (TVar6 = TypeIds_Number, (ulong)pRVar5 >> 0x32 == 0)) {
    pRVar5 = UnsafeVarTo<Js::RecyclableObject>(pRVar5);
    if (pRVar5 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_008c96a6;
      *puVar4 = 0;
    }
    TVar6 = ((pRVar5->type).ptr)->typeId;
    if (0x57 < (int)TVar6) {
      BVar3 = RecyclableObject::IsExternal(pRVar5);
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
LAB_008c96a6:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    }
  }
  pResolvedObject->typeId = TVar6;
  pResolvedObject->address = (IDiagObjectAddress *)0x0;
  alloc = GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext);
  this_00 = (RecyclableMethodsGroupDisplay *)new<Memory::ArenaAllocator>(0x40,alloc,0x366bee);
  RecyclableMethodsGroupDisplay::RecyclableMethodsGroupDisplay(this_00,this,pResolvedObject);
  pResolvedObject->objectDisplay = (IDiagObjectModelDisplay *)this_00;
  return 1;
}

Assistant:

BOOL RecyclableMethodsGroupWalker::GetGroupObject(ResolvedObject* pResolvedObject)
    {
        Assert(pResolvedObject);

        // This is fake [Methods] object.
        pResolvedObject->name           = _u("[Methods]");
        pResolvedObject->obj            = Js::VarTo<Js::RecyclableObject>(instance);
        pResolvedObject->scriptContext  = scriptContext;
        pResolvedObject->typeId         = JavascriptOperators::GetTypeId(pResolvedObject->obj);
        pResolvedObject->address        = nullptr; // Methods object will not be editable

        pResolvedObject->objectDisplay  = Anew(GetArenaFromContext(scriptContext), RecyclableMethodsGroupDisplay, this, pResolvedObject);

        return TRUE;
    }